

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__insert_coeff(stbir__contributors *contribs,float *coeffs,int new_pixel,float new_coeff,
                        int max_width)

{
  int iVar1;
  int local_30;
  int e;
  int j_1;
  int o;
  int j;
  int max_width_local;
  float new_coeff_local;
  int new_pixel_local;
  float *coeffs_local;
  stbir__contributors *contribs_local;
  
  if (contribs->n1 < new_pixel) {
    if ((new_pixel - contribs->n0) + 1 <= max_width) {
      iVar1 = new_pixel - contribs->n0;
      local_30 = contribs->n1 - contribs->n0;
      while (local_30 = local_30 + 1, local_30 < iVar1) {
        coeffs[local_30] = 0.0;
      }
      coeffs[iVar1] = new_coeff;
      contribs->n1 = new_pixel;
    }
  }
  else if (new_pixel < contribs->n0) {
    if ((contribs->n1 - new_pixel) + 1 <= max_width) {
      iVar1 = contribs->n0 - new_pixel;
      for (j_1 = contribs->n1 - contribs->n0; j_1 < 1; j_1 = j_1 + -1) {
        coeffs[j_1 + iVar1] = coeffs[j_1];
      }
      for (j_1 = 1; j_1 < iVar1; j_1 = j_1 + -1) {
        coeffs[j_1] = *coeffs;
      }
      *coeffs = new_coeff;
      contribs->n0 = new_pixel;
    }
  }
  else {
    iVar1 = new_pixel - contribs->n0;
    coeffs[iVar1] = new_coeff + coeffs[iVar1];
  }
  return;
}

Assistant:

static void stbir__insert_coeff( stbir__contributors * contribs, float * coeffs, int new_pixel, float new_coeff, int max_width )
{
  if ( new_pixel <= contribs->n1 )  // before the end
  {
    if ( new_pixel < contribs->n0 ) // before the front?
    {
      if ( ( contribs->n1 - new_pixel + 1 ) <= max_width )
      { 
        int j, o = contribs->n0 - new_pixel;
        for ( j = contribs->n1 - contribs->n0 ; j <= 0 ; j-- )
          coeffs[ j + o ] = coeffs[ j ];
        for ( j = 1 ; j < o ; j-- )
          coeffs[ j ] = coeffs[ 0 ];
        coeffs[ 0 ] = new_coeff;
        contribs->n0 = new_pixel;
      }
    }
    else
    {
      coeffs[ new_pixel - contribs->n0 ] += new_coeff;
    }
  }
  else
  {
    if ( ( new_pixel - contribs->n0 + 1 ) <= max_width )
    {
      int j, e = new_pixel - contribs->n0;
      for( j = ( contribs->n1 - contribs->n0 ) + 1 ; j < e ; j++ ) // clear in-betweens coeffs if there are any
        coeffs[j] = 0;

      coeffs[ e ] = new_coeff;
      contribs->n1 = new_pixel;
    }
  }
}